

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validate.cc
# Opt level: O0

void ParseOptions(int argc,char **argv)

{
  anon_class_1_0_00000001 local_169;
  Callback local_168;
  allocator<char> local_141;
  string local_140;
  anon_class_1_0_00000001 local_119;
  NullCallback local_118;
  anon_class_1_0_00000001 local_f1;
  NullCallback local_f0;
  anon_class_1_0_00000001 local_c9;
  NullCallback local_c8;
  undefined1 local_a8 [8];
  OptionParser parser;
  char **argv_local;
  int argc_local;
  
  parser.on_error_._M_invoker = (_Invoker_type)argv;
  wabt::OptionParser::OptionParser
            ((OptionParser *)local_a8,"wasm-validate",
             "  Read a file in the WebAssembly binary format, and validate it.\n\nexamples:\n  # validate binary file test.wasm\n  $ wasm-validate test.wasm\n"
            );
  std::function<void()>::function<ParseOptions(int,char**)::__0,void>
            ((function<void()> *)&local_c8,&local_c9);
  wabt::OptionParser::AddOption
            ((OptionParser *)local_a8,'v',"verbose","Use multiple times for more info",&local_c8);
  std::function<void_()>::~function(&local_c8);
  wabt::Features::AddOptions(&s_features,(OptionParser *)local_a8);
  std::function<void()>::function<ParseOptions(int,char**)::__1,void>
            ((function<void()> *)&local_f0,&local_f1);
  wabt::OptionParser::AddOption
            ((OptionParser *)local_a8,"no-debug-names","Ignore debug names in the binary file",
             &local_f0);
  std::function<void_()>::~function(&local_f0);
  std::function<void()>::function<ParseOptions(int,char**)::__2,void>
            ((function<void()> *)&local_118,&local_119);
  wabt::OptionParser::AddOption
            ((OptionParser *)local_a8,"ignore-custom-section-errors",
             "Ignore errors in custom sections",&local_118);
  std::function<void_()>::~function(&local_118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"filename",&local_141);
  std::function<void(char_const*)>::function<ParseOptions(int,char**)::__3,void>
            ((function<void(char_const*)> *)&local_168,&local_169);
  wabt::OptionParser::AddArgument((OptionParser *)local_a8,&local_140,One,&local_168);
  std::function<void_(const_char_*)>::~function(&local_168);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  wabt::OptionParser::Parse((OptionParser *)local_a8,argc,(char **)parser.on_error_._M_invoker);
  wabt::OptionParser::~OptionParser((OptionParser *)local_a8);
  return;
}

Assistant:

static void ParseOptions(int argc, char** argv) {
  OptionParser parser("wasm-validate", s_description);

  parser.AddOption('v', "verbose", "Use multiple times for more info", []() {
    s_verbose++;
    s_log_stream = FileStream::CreateStderr();
  });
  s_features.AddOptions(&parser);
  parser.AddOption("no-debug-names", "Ignore debug names in the binary file",
                   []() { s_read_debug_names = false; });
  parser.AddOption("ignore-custom-section-errors",
                   "Ignore errors in custom sections",
                   []() { s_fail_on_custom_section_error = false; });
  parser.AddArgument("filename", OptionParser::ArgumentCount::One,
                     [](const char* argument) {
                       s_infile = argument;
                       ConvertBackslashToSlash(&s_infile);
                     });
  parser.Parse(argc, argv);
}